

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

float ImGui::CalcItemWidth(void)

{
  ImGuiWindow *pIVar1;
  float *pfVar2;
  ImVec2 IVar3;
  float fVar4;
  float fVar5;
  
  pIVar1 = GImGui->CurrentWindow;
  pfVar2 = &(GImGui->NextItemData).Width;
  if (((GImGui->NextItemData).Flags & 1) == 0) {
    pfVar2 = &(pIVar1->DC).ItemWidth;
  }
  fVar5 = *pfVar2;
  if (fVar5 < 0.0) {
    IVar3 = GetContentRegionMaxAbs();
    fVar4 = fVar5 + (IVar3.x - (pIVar1->DC).CursorPos.x);
    fVar5 = 1.0;
    if (1.0 <= fVar4) {
      fVar5 = fVar4;
    }
  }
  return (float)(int)fVar5;
}

Assistant:

float ImGui::CalcItemWidth()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    float w;
    if (g.NextItemData.Flags & ImGuiNextItemDataFlags_HasWidth)
        w = g.NextItemData.Width;
    else
        w = window->DC.ItemWidth;
    if (w < 0.0f)
    {
        float region_max_x = GetContentRegionMaxAbs().x;
        w = ImMax(1.0f, region_max_x - window->DC.CursorPos.x + w);
    }
    w = IM_FLOOR(w);
    return w;
}